

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O3

ExpressionResult __thiscall
KV::ExpressionEngine::evaluateExpression
          (ExpressionEngine *this,string_view *expression,size_t offset)

{
  ParseException *this_00;
  ExpressionResult EVar1;
  LineColumn_t lineColumn;
  anon_class_48_6_102092b0 evaluate;
  array<char,_7UL> unsupportedOps;
  anon_class_8_1_3273dc56 peekChar;
  array<char,_11UL> controls;
  size_t local_98;
  string local_90;
  string_view *local_70;
  undefined7 *local_68;
  ExpressionEngine *local_60;
  string_view **local_58;
  undefined4 *local_50;
  undefined1 *local_48;
  undefined4 local_40;
  undefined3 uStack_3c;
  string_view *local_38;
  undefined7 local_30;
  undefined4 uStack_29;
  
  local_48 = (undefined1 *)&local_98;
  local_68 = &local_30;
  local_30 = 0x5b2928217c2624;
  uStack_29 = 0x9200a5d;
  local_50 = &local_40;
  uStack_3c = 0x2f2a2d;
  local_40 = 0x2b3d3c3e;
  local_58 = &local_38;
  local_98 = offset;
  local_70 = expression;
  local_60 = this;
  local_38 = expression;
  if (expression->_M_str[offset] == '[') {
    local_48 = (undefined1 *)&local_98;
    EVar1 = const::$_1::operator()
                      ((__1 *)&local_70,offset + 1,']',(anon_class_48_6_102092b0 *)&local_70);
    return EVar1;
  }
  this_00 = (ParseException *)__cxa_allocate_exception(0x38);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Invalid expression","");
  lineColumn = ResolveLineColumn(expression,local_98);
  ParseException::ParseException(this_00,&local_90,lineColumn);
  __cxa_throw(this_00,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

ExpressionEngine::ExpressionResult ExpressionEngine::evaluateExpression( const std::string_view &expression, const size_t offset /*= 0*/ ) const
	{
		constexpr const std::array< char, 11 > controls = { '$', '&', '|', '!', '(', ')', '[', ']', '\n', ' ', '\t' };
		constexpr const std::array< char, 7 > unsupportedOps = { '>', '<', '=', '+', '-', '*', '/' };

		enum class LogicOp
		{
			NONE,
			OR,
			AND,
			UNSET // Special case for error handling when parsing
		};

		auto peekChar = [ &expression ]( const size_t index ) -> char
		{
			return ( index < expression.size() ) ? expression[ index ] : '\0';
		};

		auto evaluate = [ & ]( const size_t start, const char expressionEnd, auto &evaluateRecursive ) -> ExpressionResult
		{
			LogicOp currentOp = LogicOp::NONE;
			std::optional< bool > evaluation;

			bool isNot = false;

			for ( size_t i = start; i < expression.size(); ++i )
			{
				if ( expression[ i ] == '\n' )
				{
					const std::string errMsg = std::string( "Expected '" ) + expressionEnd + std::string( "', got EOL instead" );
					throw ParseException( errMsg, ResolveLineColumn( expression, i ) );
				}
				else if ( expression[ i ] == expressionEnd )
				{
					if ( !evaluation.has_value() )
						throw ParseException( "Expected an expression", ResolveLineColumn( expression, i ) );
					else if ( currentOp != LogicOp::NONE && currentOp != LogicOp::UNSET )
					{
						const std::string errMsg = std::string( "Expected primary-expression before '" ) + expressionEnd + std::string( "' token" );
						throw ParseException( errMsg, ResolveLineColumn( expression, i ) );
					}
					else
						return { evaluation.value(), i };
				}
				else if ( expression[ i ] == '!' )
				{
					isNot = !isNot;
					continue;
				}
				else if ( expression[ i ] == '(' )
				{
					ExpressionResult nextEvaluation = evaluateRecursive( i + 1, ')', evaluateRecursive );

					if ( isNot )
					{
						nextEvaluation.result = !nextEvaluation.result;
						isNot = false;
					}

					switch ( currentOp )
					{
						case LogicOp::NONE:
						{
							evaluation = nextEvaluation.result;
							break;
						}
						case LogicOp::OR:
						{
							evaluation = ( evaluation.value() || nextEvaluation.result );
							break;
						}
						case LogicOp::AND:
						{
							evaluation = ( evaluation.value() && nextEvaluation.result );
							break;
						}
						case LogicOp::UNSET:
						{
							throw ParseException( "Expected logical operator, expression incomplete", ResolveLineColumn( expression, i ) );
							break;
						}
					}

					currentOp = LogicOp::UNSET;
					i = nextEvaluation.end;

					continue;
				}
				else if ( expression[ i ] == '$' )
				{
					size_t len = 0;

					for ( size_t j = i + 1; j < expression.size(); ++j )
					{
						if ( std::find( controls.begin(), controls.end(), expression[ j ] ) != controls.end() )
							break;

						++len;
					}

					if ( len == 0 )
						throw ParseException( "Expected symbol", ResolveLineColumn( expression, i ) );
					else
					{
						const std::string name = std::string( expression, i + 1, len );
						const bool condition = ( isNot ) ? !getCondition( name ) : getCondition( name );

						isNot = false;

						switch ( currentOp )
						{
							case LogicOp::NONE:
							{
								evaluation = condition;
								break;
							}
							case LogicOp::OR:
							{
								evaluation = ( evaluation.value() || condition );
								break;
							}
							case LogicOp::AND:
							{
								evaluation = ( evaluation.value() && condition );
								break;
							}
							case LogicOp::UNSET:
							{
								throw ParseException( "Expected logical operator, expression incomplete", ResolveLineColumn( expression, i ) );
								break;
							}
						}

						currentOp = LogicOp::UNSET;
						i += len;
						continue;
					}

				}
				else if ( expression[ i ] == '&' )
				{
					if ( peekChar( i + 1 ) != '&' )
					{
						throw ParseException( "Bitwise operators not supported", ResolveLineColumn( expression, i ) );
					}
					else
					{
						currentOp = LogicOp::AND;
						++i;
						continue;
					}
				}
				else if ( expression[ i ] == '|' )
				{
					if ( peekChar( i + 1 ) != '|' )
					{
						throw ParseException( "Bitwise operators not supported", ResolveLineColumn( expression, i ) );
					}
					else
					{
						currentOp = LogicOp::OR;
						++i;
						continue;
					}
				}
				else if ( auto it = std::find( unsupportedOps.cbegin(), unsupportedOps.cend(), expression[ i ] ); it != unsupportedOps.cend() )
				{
					const std::string errMsg = std::string( "Unsupported operator '" ) + *it + std::string( "'" ) ;
					throw ParseException( errMsg, ResolveLineColumn( expression, i ) );
				}
			}

			throw ParseException( "Expected end of expression", ResolveLineColumn( expression, offset ) );
		};

		if ( expression[ offset ] != '[' )
			throw ParseException( "Invalid expression", ResolveLineColumn( expression, offset ) );

		return evaluate( offset + 1, ']', evaluate );
	}